

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O3

int test(char *url)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  void *__ptr;
  undefined8 uVar5;
  long lVar6;
  CURL *pCVar7;
  long lVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int *piVar12;
  ulong uVar13;
  CURL **ppCVar14;
  timeval tVar15;
  int maxfd;
  int running;
  long timeout;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  long local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  sVar4 = strlen(url);
  sVar4 = sVar4 + 5;
  __ptr = malloc(sVar4);
  tv_test_start = tutil_tvnow();
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    iVar3 = 0x7e;
  }
  else {
    easy[0] = (CURL *)0x0;
    easy[1] = (CURL *)0x0;
    easy[2] = (CURL *)0x0;
    sockets[0] = -1;
    sockets[1] = -1;
    sockets[2] = -1;
    iVar3 = curl_global_init(3);
    uVar11 = _stderr;
    if (iVar3 == 0) {
      if (res == 0) {
        lVar6 = curl_multi_init();
        if (lVar6 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x74);
          res = 0x7b;
        }
        else if (res == 0) {
          cVar2 = '\0';
          local_1dc = 0;
LAB_001023f3:
          do {
            local_1d0 = -99;
            local_1d8 = -99;
            cVar1 = cVar2;
            if (cVar2 == '\0') {
              pCVar7 = (CURL *)curl_easy_init();
              easy[local_1dc] = pCVar7;
              if (pCVar7 == (CURL *)0x0) {
                curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x87);
                res = 0x7c;
              }
              else if (res == 0) {
                ppCVar14 = easy + local_1dc;
                if (local_1dc % 3 == 2) {
                  curl_msnprintf(__ptr,sVar4,"%s0200",url);
                  iVar3 = curl_easy_setopt(*ppCVar14,0x6b,8);
                  uVar11 = _stderr;
                  if (iVar3 == 0) {
LAB_001024cb:
                    if (res != 0) break;
                    iVar3 = curl_easy_setopt(*ppCVar14,0x4a,1);
                    uVar11 = _stderr;
                    if (iVar3 == 0) {
                      if (res != 0) break;
                      iVar3 = curl_easy_setopt(*ppCVar14,0x2712,__ptr);
                      uVar11 = _stderr;
                      if (iVar3 == 0) {
                        if (res != 0) break;
                        iVar3 = curl_easy_setopt(*ppCVar14,0x29,1);
                        uVar11 = _stderr;
                        if (iVar3 == 0) {
                          if (res != 0) break;
                          iVar3 = curl_easy_setopt(*ppCVar14,0x50,1);
                          uVar11 = _stderr;
                          if (iVar3 == 0) {
                            if (res != 0) break;
                            iVar3 = curl_easy_setopt(*ppCVar14,0x2715,"testuser:testpass");
                            uVar11 = _stderr;
                            if (iVar3 == 0) {
                              if (res != 0) break;
                              iVar3 = curl_easy_setopt(*ppCVar14,0x4e2b,callback);
                              uVar11 = _stderr;
                              if (iVar3 == 0) {
                                if (res != 0) break;
                                iVar3 = curl_easy_setopt(*ppCVar14,0x2711);
                                uVar11 = _stderr;
                                if (iVar3 == 0) {
                                  if (res != 0) break;
                                  iVar3 = curl_easy_setopt(*ppCVar14,0x2a,1);
                                  uVar11 = _stderr;
                                  if (iVar3 == 0) {
                                    if (res != 0) break;
                                    iVar3 = curl_multi_add_handle(lVar6,*ppCVar14);
                                    uVar11 = _stderr;
                                    if (iVar3 == 0) {
                                      if (res == 0) {
                                        local_1dc = local_1dc + 1;
                                        cVar1 = '\x01';
                                        goto LAB_0010266c;
                                      }
                                      break;
                                    }
                                    uVar5 = curl_multi_strerror(iVar3);
                                    pcVar9 = 
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                                    uVar10 = 0x9a;
                                  }
                                  else {
                                    uVar5 = curl_easy_strerror(iVar3);
                                    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                    uVar10 = 0x98;
                                  }
                                }
                                else {
                                  uVar5 = curl_easy_strerror(iVar3);
                                  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                  uVar10 = 0x97;
                                }
                              }
                              else {
                                uVar5 = curl_easy_strerror(iVar3);
                                pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                uVar10 = 0x96;
                              }
                            }
                            else {
                              uVar5 = curl_easy_strerror(iVar3);
                              pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                              uVar10 = 0x95;
                            }
                          }
                          else {
                            uVar5 = curl_easy_strerror(iVar3);
                            pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                            uVar10 = 0x94;
                          }
                        }
                        else {
                          uVar5 = curl_easy_strerror(iVar3);
                          pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                          uVar10 = 0x93;
                        }
                      }
                      else {
                        uVar5 = curl_easy_strerror(iVar3);
                        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                        uVar10 = 0x92;
                      }
                    }
                    else {
                      uVar5 = curl_easy_strerror(iVar3);
                      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                      uVar10 = 0x91;
                    }
                  }
                  else {
                    uVar5 = curl_easy_strerror(iVar3);
                    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar10 = 0x8b;
                  }
                }
                else {
                  curl_msnprintf(__ptr,sVar4,"%s0100",url);
                  iVar3 = curl_easy_setopt(*ppCVar14,0x6b,1);
                  uVar11 = _stderr;
                  if (iVar3 == 0) goto LAB_001024cb;
                  uVar5 = curl_easy_strerror(iVar3);
                  pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar10 = 0x8f;
                }
LAB_00102d47:
                curl_mfprintf(uVar11,pcVar9,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                              ,uVar10,iVar3,uVar5);
                res = iVar3;
              }
              break;
            }
LAB_0010266c:
            iVar3 = curl_multi_perform(lVar6,&local_1d4);
            uVar11 = _stderr;
            if (iVar3 != 0) {
              uVar5 = curl_multi_strerror(iVar3);
              pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar10 = 0x9f;
              goto LAB_00102d47;
            }
            if (local_1d4 < 0) {
              pcVar9 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar11 = 0x9f;
LAB_00102a4a:
              curl_mfprintf(_stderr,pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar11);
              res = 0x7a;
              break;
            }
            if (res != 0) break;
            tVar15 = tutil_tvnow();
            lVar8 = tutil_tvdiff(tVar15,tv_test_start);
            if (5000 < lVar8) {
              uVar11 = 0xa1;
LAB_00102b4a:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                            ,uVar11);
              res = 0x7d;
              break;
            }
            if ((res != 0) || ((cVar1 == '\x02' && (local_1d4 == 0)))) break;
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            iVar3 = curl_multi_fdset(lVar6,&local_b8,&local_138,&local_1b8,&local_1d8);
            uVar11 = _stderr;
            if (iVar3 != 0) {
              uVar5 = curl_multi_strerror(iVar3);
              pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar10 = 0xaa;
              goto LAB_00102d47;
            }
            if (local_1d8 < -1) {
              pcVar9 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar11 = 0xaa;
              goto LAB_00102a4a;
            }
            if (res != 0) break;
            cVar2 = '\x02';
            if (cVar1 == '\x01') {
              if (local_1d8 != -1) {
                curl_mfprintf(_stderr,
                              "Warning: socket did not open immediately for new handle (trying again)\n"
                             );
                cVar2 = '\x01';
                goto LAB_001023f3;
              }
              cVar2 = (2 < local_1dc) * '\x02';
            }
            iVar3 = curl_multi_timeout(lVar6,&local_1d0);
            uVar11 = _stderr;
            if (iVar3 != 0) {
              uVar5 = curl_multi_strerror(iVar3);
              pcVar9 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
              uVar10 = 0xb8;
              goto LAB_00102d47;
            }
            if (local_1d0 < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xb8,local_1d0);
              res = 0x73;
              break;
            }
            if (res != 0) break;
            curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xbd,local_1dc);
            if (local_1d0 == -1) {
              local_1c8.tv_sec = 6;
              local_1c8.tv_usec = 0;
              if (local_1dc == 3 && local_1d4 == 0) break;
            }
            else {
              lVar8 = local_1d0;
              if (0x7ffffffe < local_1d0) {
                lVar8 = 0x7fffffff;
              }
              local_1c8.tv_sec = (__time_t)((int)lVar8 / 1000);
              local_1c8.tv_usec = (__suseconds_t)(((int)lVar8 % 1000) * 1000);
            }
            iVar3 = select_wrapper(local_1d8 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
            if (iVar3 == -1) {
              piVar12 = __errno_location();
              uVar11 = _stderr;
              iVar3 = *piVar12;
              pcVar9 = strerror(iVar3);
              curl_mfprintf(uVar11,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xd0,iVar3,pcVar9);
              res = 0x79;
              break;
            }
            if (res != 0) break;
            tVar15 = tutil_tvnow();
            lVar8 = tutil_tvdiff(tVar15,tv_test_start);
            if (5000 < lVar8) {
              uVar11 = 0xd2;
              goto LAB_00102b4a;
            }
          } while (res == 0);
        }
        ppCVar14 = easy;
        piVar12 = counter;
        uVar13 = 0;
        do {
          curl_mprintf("Data connection %d: %d\n",uVar13 & 0xffffffff,*piVar12);
          curl_multi_remove_handle(lVar6,*ppCVar14);
          curl_easy_cleanup(*ppCVar14);
          uVar13 = uVar13 + 1;
          ppCVar14 = ppCVar14 + 1;
          piVar12 = piVar12 + 1;
        } while (uVar13 != 3);
        curl_multi_cleanup(lVar6);
        curl_global_cleanup();
        free(__ptr);
        iVar3 = res;
        goto LAB_001023b7;
      }
    }
    else {
      uVar5 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar11,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x6e,iVar3,uVar5);
      res = iVar3;
    }
    iVar3 = res;
    free(__ptr);
  }
LAB_001023b7:
  return iVar3;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        snprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        snprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000 + 1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    printf("Data connection %d: %d\n", i, counter[i]);
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}